

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,true>>>
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_true>_>
                *mb)

{
  Chain_representative_cycles_option *this;
  pointer pvVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  undefined4 **local_1d0;
  char *local_1c8;
  char *local_1c0;
  shared_count sStack_1b8;
  undefined **local_1b0;
  ulong local_1a8;
  shared_count sStack_1a0;
  char *local_198;
  undefined **local_190;
  undefined1 local_188;
  undefined8 *local_180;
  long **local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 *local_160;
  long *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  this = &(mb->matrix_).super_Chain_representative_cycles_option;
  Gudhi::persistence_matrix::
  Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_true>_>_>
  ::update_representative_cycles(this);
  if ((mb->matrix_).super_Chain_representative_cycles_option.representativeCycles_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (mb->matrix_).super_Chain_representative_cycles_option.representativeCycles_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Gudhi::persistence_matrix::
    Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_true>_>_>
    ::update_representative_cycles(this);
  }
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x9c7);
  local_1a8 = local_1a8 & 0xffffffffffffff00;
  local_1b0 = &PTR__lazy_ostream_002230e0;
  sStack_1a0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  lVar5 = (long)(mb->matrix_).super_Chain_representative_cycles_option.representativeCycles_.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(mb->matrix_).super_Chain_representative_cycles_option.representativeCycles_.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_168 = (lVar5 >> 3) * -0x5555555555555555;
  local_158 = &local_168;
  local_160 = &local_16c;
  local_16c = 5;
  local_1c8 = (char *)CONCAT71(local_1c8._1_7_,lVar5 == 0x78);
  local_1c0 = (char *)0x0;
  sStack_1b8.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_178 = &local_158;
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_00223460;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = &local_160;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002230a0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_1b0,&local_40,0x9c7,1,2,2,"cycles.size()",&local_190,"5",&local_1e8);
  boost::detail::shared_count::~shared_count(&sStack_1b8);
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_190 = (undefined **)((ulong)local_190 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_1e8,(iterator)0x0,(uint *)&local_190);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x9db);
  pvVar1 = (this->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
  puVar3 = *(pointer *)
            ((long)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl + 8);
  sVar6 = (long)puVar3 - (long)puVar2;
  if (sVar6 == (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(puVar2,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar6);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar7);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = "cycles[0] == tmp";
  local_1c0 = "";
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_002232a0;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_178 = (long **)&local_1c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_190 = (undefined **)CONCAT44(local_190._4_4_,1);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_1e8,
               (iterator)
               local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_190);
  }
  else {
    *local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 1;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x9dd);
  pvVar1 = (this->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar1[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar1[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar6 = (long)puVar3 - (long)puVar2;
  if (sVar6 == (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(puVar2,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar6);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar7);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = "cycles[1] == tmp";
  local_1c0 = "";
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_002232a0;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_178 = (long **)&local_1c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 2;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x9df);
  pvVar1 = (this->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar1[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar1[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar6 = (long)puVar3 - (long)puVar2;
  if (sVar6 == (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(puVar2,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar6);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar7);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = "cycles[2] == tmp";
  local_1c0 = "";
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_002232a0;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_178 = (long **)&local_1c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 3;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  local_190 = (undefined **)CONCAT44(local_190._4_4_,5);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_1e8,
               (iterator)
               local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_190);
  }
  else {
    *local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 5;
    local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x9e3);
  pvVar1 = (this->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar1[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar1[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar6 = (long)puVar3 - (long)puVar2;
  if (sVar6 == (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(puVar2,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar6);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar7);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = "cycles[3] == tmp";
  local_1c0 = "";
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_002232a0;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_178 = (long **)&local_1c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 7;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x9e7);
  pvVar1 = (this->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar1[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar1[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar6 = (long)puVar3 - (long)puVar2;
  if (sVar6 == (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(puVar2,local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar6);
      bVar7 = iVar4 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  local_1b0 = (undefined **)CONCAT71(local_1b0._1_7_,bVar7);
  local_1a8 = 0;
  sStack_1a0.pi_ = (sp_counted_base *)0x0;
  local_1c8 = "cycles[4] == tmp";
  local_1c0 = "";
  local_188 = 0;
  local_190 = &PTR__lazy_ostream_002232a0;
  local_180 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_178 = (long **)&local_1c8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a0);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_representative_cycles(Matrix& mb) {
  mb.update_representative_cycles();

  const auto& cycles = mb.get_representative_cycles();
  BOOST_CHECK_EQUAL(cycles.size(), 5);

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp[0] = 1;
    BOOST_CHECK(cycles[1] == tmp);
    tmp[0] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp.push_back(4);
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp.clear();
    tmp.push_back(7);
    BOOST_CHECK(cycles[4] == tmp);
  } else {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp.push_back(1);
    BOOST_CHECK(cycles[1] == tmp);
    tmp[1] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp[1] = 4;
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp[0] = 0;
    tmp[1] = 7;
    tmp.pop_back();
    BOOST_CHECK(cycles[4] == tmp);
  }

  if constexpr (Matrix::Option_list::has_column_pairings) {
    const auto& barcode = mb.get_current_barcode();
    auto it = barcode.begin();
    for (auto& cycle : cycles) {
      BOOST_CHECK(cycle == mb.get_representative_cycle(*it));
      ++it;
    }
  }
}